

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-order.c
# Opt level: O0

void next_tick(uv_idle_t *handle)

{
  uv_loop_t *loop_00;
  uv_loop_t *loop;
  uv_idle_t *handle_local;
  
  loop_00 = handle->loop;
  uv_idle_stop(handle);
  uv_idle_init(loop_00,&idle_handle);
  uv_idle_start(&idle_handle,idle_cb);
  uv_timer_init(loop_00,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,0,0);
  return;
}

Assistant:

static void next_tick(uv_idle_t* handle) {
  uv_loop_t* loop = handle->loop;
  uv_idle_stop(handle);
  uv_idle_init(loop, &idle_handle);
  uv_idle_start(&idle_handle, idle_cb);
  uv_timer_init(loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 0, 0);
}